

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int fmt::v10::detail::parse_nonnegative_int<char>(char **begin,char *end,int error_value)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  uint in_EDX;
  char *in_RSI;
  long *in_RDI;
  uint max;
  long num_digits;
  char *p;
  uint prev;
  uint value;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *local_30;
  uint local_20;
  uint local_4;
  
  if ((((char *)*in_RDI != in_RSI) && ('/' < *(char *)*in_RDI)) && (*(char *)*in_RDI < ':')) {
    local_20 = 0;
    pcVar4 = (char *)*in_RDI;
    uVar3 = local_20;
    do {
      local_20 = uVar3;
      local_30 = pcVar4;
      uVar3 = local_20 * 10 + *local_30 + -0x30;
      pcVar4 = local_30 + 1;
      bVar2 = false;
      if ((pcVar4 != in_RSI) && (bVar2 = false, '/' < *pcVar4)) {
        bVar2 = *pcVar4 < ':';
      }
    } while (bVar2);
    lVar1 = *in_RDI;
    *in_RDI = (long)pcVar4;
    local_4 = uVar3;
    if (((9 < (long)pcVar4 - lVar1) && (local_4 = in_EDX, (long)pcVar4 - lVar1 == 10)) &&
       (local_4 = in_EDX, (ulong)local_20 * 10 + (ulong)((int)*local_30 - 0x30) < 0x80000000)) {
      local_4 = uVar3;
    }
    return local_4;
  }
  assert_fail((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffbc,&UNK_0013392f);
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}